

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<15UL> mserialize::cx_strcat<15ul>(cx_string<15UL> *strings)

{
  cx_string<15UL> *in_RDI;
  size_t s;
  size_t i;
  char *out;
  size_t size [2];
  char *data [2];
  char buffer [16];
  ulong local_60;
  ulong local_58;
  char *local_50;
  ulong local_48;
  size_t local_40;
  char *local_38;
  data_ref local_30;
  char local_28 [16];
  cx_string<15UL> *local_18;
  cx_string<15UL> local_10;
  
  local_18 = in_RDI;
  memset(local_28,0,0x10);
  local_38 = "";
  local_30 = cx_string<15UL>::data(local_18);
  local_48 = 0;
  local_40 = cx_string<15UL>::size(local_18);
  local_50 = local_28;
  for (local_58 = 1; local_58 < 2; local_58 = local_58 + 1) {
    for (local_60 = 0; local_60 < (&local_48)[local_58]; local_60 = local_60 + 1) {
      *local_50 = (&local_38)[local_58][local_60];
      local_50 = local_50 + 1;
    }
  }
  cx_string<15UL>::cx_string(&local_10,local_28);
  return (cx_string<15UL>)local_10._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}